

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.cpp
# Opt level: O2

void __thiscall Executor::callValue(Executor *this,CallNode *node,string *name,Value *value)

{
  unsigned_long __val;
  Value *pVVar1;
  _Alloc_hider _Var2;
  Executor *pEVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int __flags;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  void *__child_stack;
  void *__child_stack_00;
  undefined8 uVar6;
  Executor *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> argName;
  shared_ptr<ExpressionNode> argValue;
  TypeName type;
  Context newContext;
  FunctionValueAnalyser valueAnalyser;
  Executor functionExecutor;
  undefined8 *local_430;
  string local_428;
  Executor *local_408;
  __shared_ptr<RuntimeSymbol,(__gnu_cxx::_Lock_policy)2> local_400 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  Context local_390;
  string local_340;
  string local_320;
  undefined1 local_300 [24];
  _Storage<std::__cxx11::list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>,_false>
  local_2e8;
  bool local_2d0;
  element_type *local_2c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_2c0;
  undefined1 local_2b8 [80];
  bool local_268;
  Executor local_260;
  
  local_300._0_8_ = &PTR__FunctionValueAnalyser_00149d28;
  local_300[8] = false;
  local_300[0x10] = false;
  local_2d0 = false;
  local_2c8 = (element_type *)0x0;
  _Stack_2c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_268 = false;
  (*value->_vptr_Value[3])(value);
  __flags = (int)value;
  iVar4 = (*(node->super_ExpressionNode).super_Node._vptr_Node[3])(node);
  __val = *(unsigned_long *)(CONCAT44(extraout_var,iVar4) + 0x10);
  if (local_2e8._M_value.
      super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
      ._M_impl._M_node._M_size != __val) {
    std::operator+(&local_3b0,"Function ",name);
    std::operator+(&local_3f0,&local_3b0," expected ");
    std::__cxx11::to_string
              (&local_320,
               local_2e8._M_value.
               super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
               ._M_impl._M_node._M_size);
    std::operator+(&local_3d0,&local_3f0,&local_320);
    std::operator+(&local_428,&local_3d0,", but got ");
    std::__cxx11::to_string(&local_340,__val);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_390,
                   &local_428,&local_340);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_260,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_390,
                   " arguments!");
    reportError((string *)&local_260,(Node *)node);
  }
  Context::clone(&local_390,(__fn *)(local_300 + 0x48),__child_stack,__flags,in_R8);
  Context::enterScope(&local_390);
  iVar4 = (*(node->super_ExpressionNode).super_Node._vptr_Node[3])(node);
  local_408 = this;
  if (local_2d0 != false) {
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_300 + 0x18)
    ;
    local_430 = *(undefined8 **)CONCAT44(extraout_var_00,iVar4);
    for (uVar6 = local_2e8._M_value.
                 super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
                 ._M_impl._M_node.super__List_node_base._M_next; iVar4 = (int)pbVar5,
        (_List_node_base *)uVar6 != (_List_node_base *)(local_300 + 0x18);
        uVar6 = ((_List_node_base *)uVar6)->_M_next) {
      std::__cxx11::string::string((string *)&local_428,(string *)(uVar6 + 0x10));
      local_3b0._M_dataplus._M_p._0_4_ =
           *(undefined4 *)&((_List_node_base *)(uVar6 + 0x30))->_M_next;
      std::__shared_ptr<ExpressionNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<ExpressionNode,_(__gnu_cxx::_Lock_policy)2> *)&local_3d0,
                 (__shared_ptr<ExpressionNode,_(__gnu_cxx::_Lock_policy)2> *)(local_430 + 2));
      Context::clone((Context *)&local_260,(__fn *)&local_390,__child_stack_00,iVar4,in_R8);
      pbVar5 = &local_3d0;
      in_R8 = &local_260;
      std::
      make_unique<RuntimeVariableSymbol,std::__cxx11::string_const&,TypeName_const&,std::shared_ptr<ExpressionNode>&,Context>
                (&local_3f0,(TypeName *)&local_428,(shared_ptr<ExpressionNode> *)&local_3b0,
                 (Context *)&local_3d0);
      std::
      deque<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>_>_>
      ::~deque((deque<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>_>_>
                *)&local_260);
      std::__shared_ptr<RuntimeSymbol,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<RuntimeVariableSymbol,std::default_delete<RuntimeVariableSymbol>,void>
                (local_400,
                 (unique_ptr<RuntimeVariableSymbol,_std::default_delete<RuntimeVariableSymbol>_> *)
                 &local_3f0);
      Context::addSymbol(&local_390,&local_428,(shared_ptr<RuntimeSymbol> *)local_400);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_3f8);
      local_430 = (undefined8 *)*local_430;
      if ((long *)local_3f0._M_dataplus._M_p != (long *)0x0) {
        (**(code **)(*(long *)local_3f0._M_dataplus._M_p + 8))();
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_3d0._M_string_length);
      std::__cxx11::string::~string((string *)&local_428);
    }
    Executor(&local_260,&local_390);
    (*(local_2c8->super_StatementNode).super_Node._vptr_Node[2])(local_2c8,&local_260);
    pEVar3 = local_408;
    Context::leaveScope(&local_390);
    std::__cxx11::stringbuf::str();
    std::operator<<((ostream *)&pEVar3->stdout_,(string *)&local_428);
    std::__cxx11::string::~string((string *)&local_428);
    if ((local_300[0x10] != true) || (local_300._12_4_ != Void)) {
      (**(code **)(*(long *)local_260.value_._M_t.
                            super___uniq_ptr_impl<Value,_std::default_delete<Value>_>._M_t.
                            super__Tuple_impl<0UL,_Value_*,_std::default_delete<Value>_>.
                            super__Head_base<0UL,_Value_*,_false>._M_head_impl + 0x10))(&local_428);
      _Var2._M_p = local_428._M_dataplus._M_p;
      local_428._M_dataplus._M_p = (pointer)0x0;
      pVVar1 = (pEVar3->value_)._M_t.super___uniq_ptr_impl<Value,_std::default_delete<Value>_>._M_t.
               super__Tuple_impl<0UL,_Value_*,_std::default_delete<Value>_>.
               super__Head_base<0UL,_Value_*,_false>._M_head_impl;
      (pEVar3->value_)._M_t.super___uniq_ptr_impl<Value,_std::default_delete<Value>_>._M_t.
      super__Tuple_impl<0UL,_Value_*,_std::default_delete<Value>_>.
      super__Head_base<0UL,_Value_*,_false>._M_head_impl = (Value *)_Var2._M_p;
      if (pVVar1 != (Value *)0x0) {
        (*pVVar1->_vptr_Value[1])();
        if ((Value *)local_428._M_dataplus._M_p != (Value *)0x0) {
          (**(code **)(*(long *)local_428._M_dataplus._M_p + 8))();
        }
      }
    }
    ~Executor(&local_260);
    std::
    deque<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>_>_>
    ::~deque(&local_390.scopes_);
    FunctionValueAnalyser::~FunctionValueAnalyser((FunctionValueAnalyser *)local_300);
    return;
  }
  std::__throw_bad_optional_access();
}

Assistant:

void Executor::callValue(const CallNode& node, const std::string& name, const Value& value)
{
  auto valueAnalyser = FunctionValueAnalyser{};
  value.accept(valueAnalyser);

  const auto nExpectedArgs = valueAnalyser.getArguments()->size();
  const auto nProvidedArgs = node.getArguments().size();
  if(nExpectedArgs != nProvidedArgs)
    reportError("Function " + name + " expected " +
                std::to_string(nExpectedArgs) + ", but got " + std::to_string(nProvidedArgs) + " arguments!", node);

  Context newContext = valueAnalyser.getContext()->clone();

  newContext.enterScope();

  auto it = node.getArguments().begin();
  for (const auto &arg : valueAnalyser.getArguments().value())
  {
    const auto argName = arg.first;
    const auto type = arg.second;
    std::shared_ptr<ExpressionNode> argValue = *it;
    auto argSymbol = std::make_unique<RuntimeVariableSymbol>(argName, type, argValue, newContext.clone());
    newContext.addSymbol(argName, std::move(argSymbol));

    ++it;
  }

  Executor functionExecutor{newContext};
  valueAnalyser.getBody()->accept(functionExecutor);

  newContext.leaveScope();

  stdout_ << functionExecutor.getStandardOut();
  if (valueAnalyser.getReturnType() != TypeName::Void)
  {
    value_ = functionExecutor.getValue()->clone();
  }
}